

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O3

int Curl_strcasecompare(char *first,char *second)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  char cVar5;
  
  cVar1 = *first;
  if (cVar1 != '\0') {
    pcVar4 = first + 1;
    do {
      cVar2 = *second;
      if (cVar2 == '\0') goto LAB_0012a0d2;
      cVar5 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar5 = cVar1;
      }
      cVar3 = cVar2 + -0x20;
      if (0x19 < (byte)(cVar2 + 0x9fU)) {
        cVar3 = cVar2;
      }
      if (cVar5 != cVar3) goto LAB_0012a0d2;
      second = second + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  cVar1 = '\0';
LAB_0012a0d2:
  cVar2 = cVar1 + -0x20;
  if (0x19 < (byte)(cVar1 + 0x9fU)) {
    cVar2 = cVar1;
  }
  cVar1 = *second;
  cVar5 = cVar1 + -0x20;
  if (0x19 < (byte)(cVar1 + 0x9fU)) {
    cVar5 = cVar1;
  }
  return (int)(cVar2 == cVar5);
}

Assistant:

int Curl_strcasecompare(const char *first, const char *second)
{
  while(*first && *second) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second))
      /* get out of the loop as soon as they don't match */
      break;
    first++;
    second++;
  }
  /* we do the comparison here (possibly again), just to make sure that if the
     loop above is skipped because one of the strings reached zero, we must not
     return this as a successful match */
  return (Curl_raw_toupper(*first) == Curl_raw_toupper(*second));
}